

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::QueuePopMethod::QueuePopMethod
          (QueuePopMethod *this,KnownSystemName knownNameId,bool front)

{
  byte in_DL;
  undefined8 *in_RDI;
  SubroutineKind in_stack_00000028;
  KnownSystemName in_stack_0000002c;
  SystemSubroutine *in_stack_00000030;
  
  SystemSubroutine::SystemSubroutine(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
  *in_RDI = &PTR__QueuePopMethod_00dc4780;
  *(byte *)(in_RDI + 7) = in_DL & 1;
  return;
}

Assistant:

QueuePopMethod(KnownSystemName knownNameId, bool front) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), front(front) {}